

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.h
# Opt level: O0

void __thiscall
slang::ast::PrimitiveSymbol::PrimitiveSymbol
          (PrimitiveSymbol *this,Compilation *compilation,string_view name,SourceLocation loc,
          PrimitiveKind primitiveKind)

{
  string_view name_00;
  char *in_RCX;
  Scope *in_RDX;
  Symbol *in_RDI;
  SourceLocation in_R8;
  undefined4 in_R9D;
  
  name_00._M_str = in_RCX;
  name_00._M_len = (size_t)in_RDX;
  Symbol::Symbol(in_RDI,Primitive,name_00,in_R8);
  Scope::Scope(in_RDX,(Compilation *)in_R8,in_RDI);
  std::span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL>::span
            ((span<const_slang::ast::PrimitivePortSymbol_*const,_18446744073709551615UL> *)0x48ded7)
  ;
  std::span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL>::span
            ((span<const_slang::ast::PrimitiveSymbol::TableEntry,_18446744073709551615UL> *)0x48dee8
            );
  in_RDI[2].location = (SourceLocation)0x0;
  *(undefined1 *)&in_RDI[2].parentScope = 0;
  *(undefined1 *)((long)&in_RDI[2].parentScope + 1) = 0;
  *(undefined4 *)((long)&in_RDI[2].parentScope + 4) = in_R9D;
  return;
}

Assistant:

PrimitiveSymbol(Compilation& compilation, std::string_view name, SourceLocation loc,
                    PrimitiveKind primitiveKind) :
        Symbol(SymbolKind::Primitive, name, loc), Scope(compilation, this),
        primitiveKind(primitiveKind) {}